

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1bacb1::setOutputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<Imath_3_2::half_*> *hData,int width)

{
  char *pcVar1;
  DeepSlice local_48 [56];
  
  if (pixelType == 2) {
    Imf_3_4::DeepSlice::DeepSlice
              (local_48,HALF,(char *)hData->_data,8,(long)width << 3,2,1,1,0.0,false,false);
    pcVar1 = "HALF";
  }
  else if (pixelType == 1) {
    Imf_3_4::DeepSlice::DeepSlice
              (local_48,FLOAT,(char *)fData->_data,8,(long)width << 3,4,1,1,0.0,false,false);
    pcVar1 = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    Imf_3_4::DeepSlice::DeepSlice
              (local_48,UINT,(char *)uData->_data,8,(long)width << 3,4,1,1,0.0,false,false);
    pcVar1 = "UINT";
  }
  Imf_3_4::DeepFrameBuffer::insert((char *)frameBuffer,(DeepSlice *)pcVar1);
  return;
}

Assistant:

void
setOutputDeepFrameBuffer (
    DeepFrameBuffer&        frameBuffer,
    int                     pixelType,
    Array2D<unsigned int*>& uData,
    Array2D<float*>&        fData,
    Array2D<half*>&         hData,
    int                     width)
{
    switch (pixelType)
    {
        case 0:
            frameBuffer.insert (
                "UINT",
                DeepSlice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    sizeof (unsigned int)));
            break;
        case 1:
            frameBuffer.insert (
                "FLOAT",
                DeepSlice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    sizeof (float)));
            break;
        case 2:
            frameBuffer.insert (
                "HALF",
                DeepSlice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    sizeof (half)));
            break;
    }
}